

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeemitter.cpp
# Opt level: O0

Error __thiscall asmjit::CodeEmitter::commentf(CodeEmitter *this,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  Error err;
  __va_list_tag *in_stack_00000318;
  char *in_stack_00000320;
  Logger *in_stack_00000328;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined4 local_38;
  undefined4 local_34;
  undefined1 *local_30;
  undefined1 *local_28;
  Error local_1c;
  undefined8 local_18;
  long local_10;
  Error local_4;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_1c = *(Error *)(in_RDI + 0x2c);
  local_4 = local_1c;
  if (local_1c == 0) {
    if ((*(uint *)(in_RDI + 0x38) & 4) != 0) {
      local_28 = local_e8;
      local_30 = &stack0x00000008;
      local_34 = 0x30;
      local_38 = 0x10;
      local_d8 = in_RDX;
      local_d0 = in_RCX;
      local_c8 = in_R8;
      local_c0 = in_R9;
      local_18 = in_RSI;
      local_10 = in_RDI;
      local_1c = Logger::logv(in_stack_00000328,in_stack_00000320,in_stack_00000318);
    }
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

Error CodeEmitter::commentf(const char* fmt, ...) {
  Error err = _lastError;
  if (err) return err;

#if !defined(ASMJIT_DISABLE_LOGGING)
  if (_globalOptions & kOptionLoggingEnabled) {
    va_list ap;
    va_start(ap, fmt);
    err = _code->_logger->logv(fmt, ap);
    va_end(ap);
  }
#else
  ASMJIT_UNUSED(fmt);
#endif

  return err;
}